

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXModel.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Model::~Model(Model *this)

{
  Model *this_local;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Model_0037b820;
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::~shared_ptr(&this->props);
  std::__cxx11::string::~string((string *)&this->culling);
  std::__cxx11::string::~string((string *)&this->shading);
  std::
  vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>::
  ~vector(&this->attributes);
  std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>::
  ~vector(&this->geometry);
  std::vector<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>::
  ~vector(&this->materials);
  Object::~Object(&this->super_Object);
  return;
}

Assistant:

Model::~Model()
{

}